

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall dg::pta::PointerAnalysis::queue_changed(PointerAnalysis *this)

{
  ulong uVar1;
  _Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_30;
  
  uVar1 = *(long *)(this + 0x10) - *(long *)(this + 8);
  if (uVar1 != 0) {
    *(long *)(this + 0x10) = *(long *)(this + 8);
  }
  if (*(long *)(this + 0x20) != *(long *)(this + 0x28)) {
    PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_30,
               *(PointerGraph **)(this + 0x38),
               (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)(this + 0x20),true,
               (uint)(uVar1 >> 3));
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_move_assign
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)(this + 8),&local_30
              );
    std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
              (&local_30);
    if (*(long *)(this + 0x28) != *(long *)(this + 0x20)) {
      *(long *)(this + 0x28) = *(long *)(this + 0x20);
    }
  }
  return;
}

Assistant:

void queue_changed() {
        unsigned last_processed_num = to_process.size();
        to_process.clear();

        if (!changed.empty()) {
            // DONT std::move - it prevents compiler from copy ellision
            to_process = PG->getNodes(changed /* starting set */,
                                      true /* interprocedural */,
                                      last_processed_num /* expected num */);

            // since changed was not empty,
            // the to_process must not be empty too
            assert(!to_process.empty());
            assert(to_process.size() >= changed.size());
            changed.clear();
        }
    }